

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.c
# Opt level: O2

void ga_pose_compose(ga_pose *x1,ga_pose *x2,ga_pose *r)

{
  uint __line;
  char *__assertion;
  
  if (x1 == (ga_pose *)0x0) {
    __assertion = "x1";
    __line = 0x29;
  }
  else if (x2 == (ga_pose *)0x0) {
    __assertion = "x2";
    __line = 0x2a;
  }
  else if (r == (ga_pose *)0x0) {
    __assertion = "r";
    __line = 0x2b;
  }
  else if (x1 == r) {
    __assertion = "x1 != r";
    __line = 0x2c;
  }
  else if (x2 == r) {
    __assertion = "x2 != r";
    __line = 0x2d;
  }
  else {
    if (x1->reference_frame == x2->target_frame) {
      r->target_body = x1->target_body;
      r->target_frame = x1->target_frame;
      r->reference_body = x2->reference_body;
      r->reference_frame = x2->reference_frame;
      return;
    }
    __assertion = "x1->reference_frame == x2->target_frame";
    __line = 0x2e;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/rosym-project[P]dyn2b/src/dyn2b/geometry.c"
                ,__line,
                "void ga_pose_compose(const struct ga_pose *, const struct ga_pose *, struct ga_pose *)"
               );
}

Assistant:

void ga_pose_compose(
        const struct ga_pose *x1,
        const struct ga_pose *x2,
        struct ga_pose *r)
{
    assert(x1);
    assert(x2);
    assert(r);
    assert(x1 != r);
    assert(x2 != r);
    assert(x1->reference_frame == x2->target_frame);

    r->target_body = x1->target_body;
    r->target_frame = x1->target_frame;
    r->reference_body = x2->reference_body;
    r->reference_frame = x2->reference_frame;
}